

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O0

void test_memory_leaks(char *dir,int key_gt_1K,vmemcache_repl_p repl_p,uint seed)

{
  FILE *pFVar1;
  stat_t sVar2;
  stat_t sVar3;
  int iVar4;
  VMEMcache *cache_00;
  undefined8 uVar5;
  VMEMcache *cache;
  size_t max_size;
  size_t min_size;
  stat_t n_gets;
  stat_t n_evicts;
  stat_t n_puts;
  big_key bk;
  ssize_t get_ret;
  size_t sStack_40;
  int ret;
  size_t vsize;
  size_t size;
  char *get_buf;
  char *vbuf;
  vmemcache_repl_p local_18;
  uint seed_local;
  vmemcache_repl_p repl_p_local;
  int key_gt_1K_local;
  char *dir_local;
  
  vbuf._4_4_ = seed;
  local_18 = repl_p;
  seed_local = key_gt_1K;
  _repl_p_local = dir;
  srand(seed);
  n_evicts = 0;
  n_gets = 0;
  min_size = 0;
  cache_00 = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(cache_00,0x100000);
  vmemcache_set_extent_size(cache_00,0x100);
  vmemcache_set_eviction_policy(cache_00,local_18);
  iVar4 = vmemcache_add(cache_00,_repl_p_local);
  if (iVar4 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x29e,"test_memory_leaks");
    pFVar1 = _stderr;
    uVar5 = vmemcache_errormsg();
    fprintf(pFVar1,"vmemcache_new: %s",uVar5);
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_callback_on_evict(cache_00,on_evict_test_memory_leaks_cb,&n_gets);
  while( true ) {
    if (999 < n_gets) {
      verify_stat_entries(cache_00,n_evicts - n_gets);
      do {
        iVar4 = vmemcache_evict(cache_00,0);
      } while (iVar4 == 0);
      verify_stats(cache_00,n_evicts,min_size,min_size,0,n_gets,0,0,0);
      vmemcache_delete(cache_00);
      if (n_gets == n_evicts) {
        return;
      }
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2ea,"test_memory_leaks");
      fprintf(_stderr,"memory leak detected");
      fprintf(_stderr,"\n");
      abort();
    }
    iVar4 = rand();
    vsize = (ulong)(long)iVar4 % 0xff81 + 0x80;
    get_buf = (char *)malloc(vsize);
    if (get_buf == (char *)0x0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2a8,"test_memory_leaks");
      fprintf(_stderr,"out of memory");
      fprintf(_stderr,"\n");
      abort();
    }
    memset(get_buf,0x2a,vsize - 1);
    get_buf[vsize - 1] = '\0';
    if (seed_local == 0) {
      get_ret._4_4_ = vmemcache_put(cache_00,&n_evicts,8,get_buf,vsize);
    }
    else {
      memset(&n_puts,0x2a,0x400);
      bk.buf[0x3f8] = (undefined1)n_evicts;
      bk.buf[0x3f9] = n_evicts._1_1_;
      bk.buf[0x3fa] = n_evicts._2_1_;
      bk.buf[0x3fb] = n_evicts._3_1_;
      bk.buf[0x3fc] = n_evicts._4_1_;
      bk.buf[0x3fd] = n_evicts._5_1_;
      bk.buf[0x3fe] = n_evicts._6_1_;
      bk.buf[0x3ff] = n_evicts._7_1_;
      get_ret._4_4_ = vmemcache_put(cache_00,&n_puts,0x408,get_buf,vsize);
    }
    if (get_ret._4_4_ != 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2b9,"test_memory_leaks");
      sVar3 = n_evicts;
      sVar2 = n_gets;
      pFVar1 = _stderr;
      uVar5 = vmemcache_errormsg();
      fprintf(pFVar1,"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",sVar3,sVar2,uVar5);
      fprintf(_stderr,"\n");
      abort();
    }
    size = (size_t)malloc(vsize);
    if ((void *)size == (void *)0x0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2bd,"test_memory_leaks");
      fprintf(_stderr,"out of memory");
      fprintf(_stderr,"\n");
      abort();
    }
    if (seed_local == 0) {
      bk.n_puts = vmemcache_get(cache_00,&n_evicts,8,size,vsize,0,&stack0xffffffffffffffc0);
    }
    else {
      bk.n_puts = vmemcache_get(cache_00,&n_puts,0x408,size,vsize,0,&stack0xffffffffffffffc0);
    }
    if ((long)bk.n_puts < 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2c6,"test_memory_leaks");
      pFVar1 = _stderr;
      uVar5 = vmemcache_errormsg();
      fprintf(pFVar1,"vmemcache_get: %s",uVar5);
      fprintf(_stderr,"\n");
      abort();
    }
    if (bk.n_puts != vsize) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2cb,"test_memory_leaks");
      fprintf(_stderr,"vmemcache_get: wrong return value: %zi (should be %zu)",bk.n_puts,vsize);
      fprintf(_stderr,"\n");
      abort();
    }
    if (vsize != sStack_40) break;
    iVar4 = strcmp(get_buf,(char *)size);
    if (iVar4 != 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x2d5,"test_memory_leaks");
      fprintf(_stderr,"vmemcache_get: wrong value: %s (should be %s)",size,get_buf);
      fprintf(_stderr,"\n");
      abort();
    }
    free(get_buf);
    free((void *)size);
    min_size = min_size + 1;
    n_evicts = n_evicts + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
          ,0x2d0,"test_memory_leaks");
  fprintf(_stderr,"vmemcache_get: wrong size of value: %zi (should be %zu)",sStack_40,vsize);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void
test_memory_leaks(const char *dir, int key_gt_1K,
			enum vmemcache_repl_p repl_p,
			unsigned seed)
{
	char *vbuf;
	char *get_buf;
	size_t size;
	size_t vsize;
	int ret;
	ssize_t get_ret;
	struct big_key bk;

	srand(seed);

	stat_t n_puts = 0;
	stat_t n_evicts = 0;
	stat_t n_gets = 0;

	size_t min_size = VMEMCACHE_MIN_EXTENT / 2;
	size_t max_size = VMEMCACHE_MIN_POOL / 16;

	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_callback_on_evict(cache, on_evict_test_memory_leaks_cb,
					&n_evicts);

	while (n_evicts < 1000) {
		size = min_size + (size_t)rand() % (max_size - min_size + 1);

		vbuf = malloc(size);
		if (vbuf == NULL)
			UT_FATAL("out of memory");
		memset(vbuf, 42, size - 1);
		vbuf[size - 1] = '\0';

		if (key_gt_1K) {
			memset(bk.buf, 42 /* arbitrary */, sizeof(bk.buf));
			bk.n_puts = n_puts;

			ret = vmemcache_put(cache, &bk, sizeof(bk), vbuf, size);
		} else {
			ret = vmemcache_put(cache, &n_puts, sizeof(n_puts),
						vbuf, size);
		}

		if (ret)
			UT_FATAL(
				"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",
				n_puts, n_evicts, vmemcache_errormsg());

		get_buf = malloc(size);
		if (get_buf == NULL)
			UT_FATAL("out of memory");
		if (key_gt_1K)
			get_ret = vmemcache_get(cache, &bk, sizeof(bk), get_buf,
							size, 0, &vsize);
		else
			get_ret = vmemcache_get(cache, &n_puts, sizeof(n_puts),
							get_buf, size, 0,
							&vsize);
		if (get_ret < 0)
			UT_FATAL("vmemcache_get: %s", vmemcache_errormsg());

		if ((size_t)get_ret != size)
			UT_FATAL(
				"vmemcache_get: wrong return value: %zi (should be %zu)",
				get_ret, size);

		if (size != vsize)
			UT_FATAL(
				"vmemcache_get: wrong size of value: %zi (should be %zu)",
				vsize, size);

		if (strcmp(vbuf, get_buf))
			UT_FATAL(
				"vmemcache_get: wrong value: %s (should be %s)",
				get_buf, vbuf);

		free(vbuf);
		free(get_buf);

		n_gets++;
		n_puts++;
	}

	verify_stat_entries(cache, n_puts - n_evicts);

	/* free all the memory */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

	/* check statistics */
	verify_stats(cache, n_puts, n_gets, n_gets, 0, n_evicts, 0, 0, 0);

	vmemcache_delete(cache);

	if (n_evicts != n_puts)
		UT_FATAL("memory leak detected");
}